

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nihgui.cpp
# Opt level: O2

void __thiscall Dialog::add(Dialog *this,Widget *widget,int grid_x,int grid_y,int grid_w,int grid_h)

{
  Widget *local_18;
  
  widget->grid_x = grid_x;
  widget->grid_y = grid_y;
  widget->grid_w = grid_w;
  widget->grid_h = grid_h;
  local_18 = widget;
  std::__cxx11::list<Widget_*,_std::allocator<Widget_*>_>::push_back(&this->all_widgets,&local_18);
  widget->dialog = this;
  return;
}

Assistant:

void Dialog::add(Widget & widget, int grid_x, int grid_y, int grid_w,
   int grid_h)
{
   widget.grid_x = grid_x;
   widget.grid_y = grid_y;
   widget.grid_w = grid_w;
   widget.grid_h = grid_h;

   this->all_widgets.push_back(&widget);
   widget.dialog = this;
}